

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O1

CURLcode cf_hc_query(Curl_cfilter *cf,Curl_easy *data,int query,int *pres1,void *pres2)

{
  void *pvVar1;
  Curl_cfilter *pCVar2;
  _Bool _Var3;
  CURLcode CVar4;
  int query_00;
  curltime *when;
  curltime cVar5;
  
  if ((cf->field_0x24 & 1) == 0) {
    if (query == 7) {
      pvVar1 = cf->ctx;
      if ((((*(Curl_cfilter **)((long)pvVar1 + 0x30) == (Curl_cfilter *)0x0) ||
           (*(int *)((long)pvVar1 + 0x38) != 0)) ||
          (_Var3 = Curl_conn_cf_needs_flush(*(Curl_cfilter **)((long)pvVar1 + 0x30),data), !_Var3))
         && (((*(Curl_cfilter **)((long)pvVar1 + 0x60) == (Curl_cfilter *)0x0 ||
              (*(int *)((long)pvVar1 + 0x68) != 0)) ||
             (_Var3 = Curl_conn_cf_needs_flush(*(Curl_cfilter **)((long)pvVar1 + 0x60),data), !_Var3
             )))) goto LAB_001153cd;
      *pres1 = 1;
    }
    else {
      if (query == 5) {
        query_00 = 5;
      }
      else {
        if (query != 4) goto LAB_001153cd;
        query_00 = 4;
      }
      cVar5 = cf_get_max_baller_time(cf,data,query_00);
      *(time_t *)pres2 = cVar5.tv_sec;
      *(int *)((long)pres2 + 8) = cVar5.tv_usec;
    }
    return CURLE_OK;
  }
LAB_001153cd:
  pCVar2 = cf->next;
  if (pCVar2 == (Curl_cfilter *)0x0) {
    return CURLE_UNKNOWN_OPTION;
  }
  CVar4 = (*pCVar2->cft->query)(pCVar2,data,query,pres1,pres2);
  return CVar4;
}

Assistant:

static CURLcode cf_hc_query(struct Curl_cfilter *cf,
                            struct Curl_easy *data,
                            int query, int *pres1, void *pres2)
{
  struct cf_hc_ctx *ctx = cf->ctx;

  if(!cf->connected) {
    switch(query) {
    case CF_QUERY_TIMER_CONNECT: {
      struct curltime *when = pres2;
      *when = cf_get_max_baller_time(cf, data, CF_QUERY_TIMER_CONNECT);
      return CURLE_OK;
    }
    case CF_QUERY_TIMER_APPCONNECT: {
      struct curltime *when = pres2;
      *when = cf_get_max_baller_time(cf, data, CF_QUERY_TIMER_APPCONNECT);
      return CURLE_OK;
    }
    case CF_QUERY_NEED_FLUSH: {
      if(cf_hc_baller_needs_flush(&ctx->h3_baller, data)
         || cf_hc_baller_needs_flush(&ctx->h21_baller, data)) {
        *pres1 = TRUE;
        return CURLE_OK;
      }
      break;
    }
    default:
      break;
    }
  }
  return cf->next?
    cf->next->cft->query(cf->next, data, query, pres1, pres2) :
    CURLE_UNKNOWN_OPTION;
}